

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<float>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Matrix33<float>_> *this,OStream *os,int version)

{
  float local_1c;
  
  local_1c = (this->_value).x[0][0];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[0][1];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[0][2];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[1][0];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[1][1];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[1][2];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[2][0];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[2][1];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).x[2][2];
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

void
M33fAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value[0][0]);
    Xdr::write <StreamIO> (os, _value[0][1]);
    Xdr::write <StreamIO> (os, _value[0][2]);

    Xdr::write <StreamIO> (os, _value[1][0]);
    Xdr::write <StreamIO> (os, _value[1][1]);
    Xdr::write <StreamIO> (os, _value[1][2]);

    Xdr::write <StreamIO> (os, _value[2][0]);
    Xdr::write <StreamIO> (os, _value[2][1]);
    Xdr::write <StreamIO> (os, _value[2][2]);
}